

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biquad_filter.c
# Opt level: O0

int mixed_make_segment_biquad_filter
              (mixed_biquad_filter type,float frequency,uint32_t samplerate,mixed_segment *segment)

{
  int iVar1;
  biquad_filter_segment_data *data_00;
  biquad_filter_segment_data *data;
  mixed_segment *segment_local;
  uint32_t samplerate_local;
  float frequency_local;
  mixed_biquad_filter type_local;
  
  if (frequency < (float)samplerate) {
    data_00 = (biquad_filter_segment_data *)(*mixed_calloc)(1,0x70);
    if (data_00 == (biquad_filter_segment_data *)0x0) {
      mixed_err(1);
      frequency_local = 0.0;
    }
    else {
      data_00->samplerate = samplerate;
      data_00->frequency = frequency;
      data_00->Q = 1.0;
      data_00->gain = 1.0;
      data_00->type = type;
      iVar1 = biquad_reinit(data_00);
      if (iVar1 == 0) {
        (*mixed_free)(data_00);
        frequency_local = 0.0;
      }
      else {
        segment->free = biquad_filter_segment_free;
        segment->start = biquad_filter_segment_start;
        segment->mix = biquad_segment_mix;
        segment->set_in = biquad_filter_segment_set_in;
        segment->set_out = biquad_filter_segment_set_out;
        segment->info = biquad_filter_segment_info;
        segment->get = biquad_filter_segment_get;
        segment->set = biquad_filter_segment_set;
        segment->data = data_00;
        frequency_local = 1.4013e-45;
      }
    }
  }
  else {
    mixed_err(8);
    frequency_local = 0.0;
  }
  return (int)frequency_local;
}

Assistant:

MIXED_EXPORT int mixed_make_segment_biquad_filter(enum mixed_biquad_filter type, float frequency, uint32_t samplerate, struct mixed_segment *segment){
  if(samplerate <= frequency){
    mixed_err(MIXED_INVALID_VALUE);
    return 0;
  }
  
  struct biquad_filter_segment_data *data = mixed_calloc(1, sizeof(struct biquad_filter_segment_data));
  if(!data){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }

  data->samplerate = samplerate;
  data->frequency = frequency;
  data->Q = 1.0;
  data->gain = 1.0;
  data->type = type;

  if(!biquad_reinit(data)){
    mixed_free(data);
    return 0;
  }
  
  segment->free = biquad_filter_segment_free;
  segment->start = biquad_filter_segment_start;
  segment->mix = biquad_segment_mix;
  segment->set_in = biquad_filter_segment_set_in;
  segment->set_out = biquad_filter_segment_set_out;
  segment->info = biquad_filter_segment_info;
  segment->get = biquad_filter_segment_get;
  segment->set = biquad_filter_segment_set;
  segment->data = data;
  return 1;
}